

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O2

void av1_tile_set_row(TileInfo *tile,AV1_COMMON *cm,int row)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  
  bVar1 = (byte)cm->seq_params->mib_size_log2;
  iVar2 = (cm->tiles).row_start_sb[row];
  iVar3 = (cm->tiles).row_start_sb[(long)row + 1] << (bVar1 & 0x1f);
  tile->tile_row = row;
  tile->mi_row_start = iVar2 << (bVar1 & 0x1f);
  iVar2 = (cm->mi_params).mi_rows;
  if (iVar2 <= iVar3) {
    iVar3 = iVar2;
  }
  tile->mi_row_end = iVar3;
  return;
}

Assistant:

void av1_tile_set_row(TileInfo *tile, const AV1_COMMON *cm, int row) {
  assert(row < cm->tiles.rows);
  int mi_row_start = cm->tiles.row_start_sb[row]
                     << cm->seq_params->mib_size_log2;
  int mi_row_end = cm->tiles.row_start_sb[row + 1]
                   << cm->seq_params->mib_size_log2;
  tile->tile_row = row;
  tile->mi_row_start = mi_row_start;
  tile->mi_row_end = AOMMIN(mi_row_end, cm->mi_params.mi_rows);
  assert(tile->mi_row_end > tile->mi_row_start);
}